

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

AInventory * __thiscall APowerup::CreateCopy(APowerup *this,AActor *other)

{
  int iVar1;
  AActor *other_local;
  APowerup *this_local;
  
  iVar1 = *(int *)&(this->super_AInventory).field_0x4dc;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  *(int *)&(this->super_AInventory).field_0x4dc = iVar1;
  TObjPtr<AActor>::operator=(&(this->super_AInventory).Owner,other);
  (*(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[0x43])();
  if (((this->super_AInventory).ItemFlags & 0x8000) == 0) {
    TObjPtr<AActor>::operator=(&(this->super_AInventory).Owner,(AActor *)0x0);
  }
  return &this->super_AInventory;
}

Assistant:

AInventory *APowerup::CreateCopy (AActor *other)
{
	// Get the effective effect time.
	EffectTics = abs (EffectTics);
	// Abuse the Owner field to tell the
	// InitEffect method who started it;
	// this should be cleared afterwards,
	// as this powerup instance is not
	// properly attached to anything yet.
	Owner = other;
	// Actually activate the powerup.
	InitEffect ();
	// Clear the Owner field, unless it was
	// changed by the activation, for example,
	// if this instance is a morph powerup;
	// the flag tells the caller that the
	// ownership has changed so that they
	// can properly handle the situation.
	if (!(ItemFlags & IF_CREATECOPYMOVED))
	{
		Owner = NULL;
	}
	// All done.
	return this;
}